

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

bool __thiscall
chrono::ChFunction_Sequence::InsertFunct
          (ChFunction_Sequence *this,shared_ptr<chrono::ChFunction> *myfx,double duration,
          double weight,bool c0,bool c1,bool c2,int position)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *this_00;
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  _Node *p_Var4;
  bool bVar5;
  _List_node_base *p_Var6;
  ChFseqNode mfxsegment;
  shared_ptr<chrono::ChFunction> local_98;
  double local_80;
  ChFseqNode local_78;
  
  local_98.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var2 = (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_80 = weight;
  ChFseqNode::ChFseqNode(&local_78,&local_98,duration);
  if (local_98.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = &this->functions;
  local_78.weight = local_80;
  local_78.y_cont = c0;
  local_78.ydt_cont = c1;
  local_78.ydtdt_cont = c2;
  if (position == -1) {
    p_Var4 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
             _M_create_node<chrono::ChFseqNode_const&>
                       ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)this_00,
                        &local_78);
LAB_00893e2f:
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    bVar5 = true;
  }
  else {
    p_Var6 = (this_00->super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var6 != (_List_node_base *)this_00) {
      lVar3 = (long)position + 1;
      do {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) {
          p_Var4 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
                   _M_create_node<chrono::ChFseqNode_const&>
                             ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)this_00
                              ,&local_78);
          goto LAB_00893e2f;
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)this_00);
    }
    p_Var4 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
             _M_create_node<chrono::ChFseqNode_const&>
                       ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)this_00,
                        &local_78);
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    bVar5 = false;
  }
  psVar1 = &(this->functions).
            super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  Setup(this);
  if (local_78.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar5;
}

Assistant:

bool ChFunction_Sequence::InsertFunct(std::shared_ptr<ChFunction> myfx,
                                      double duration,
                                      double weight,
                                      bool c0,
                                      bool c1,
                                      bool c2,
                                      int position) {
    ChFseqNode mfxsegment(myfx, duration);
    mfxsegment.y_cont = c0;
    mfxsegment.ydt_cont = c1;
    mfxsegment.ydtdt_cont = c2;
    mfxsegment.weight = weight;

    bool inserted = false;

    if (position == -1) {
        functions.push_back(mfxsegment);
        inserted = true;
    }
    if (!inserted) {
        std::list<ChFseqNode>::iterator iter;
        size_t i = 0;
        for (iter = functions.begin(); iter != functions.end(); ++iter, ++i) {
            if (i == position) {
                functions.insert(iter, mfxsegment);
                inserted = true;
                break;
            }
        }
    }
    if (!inserted) {
        functions.push_back(mfxsegment);
    }
    // update the continuity offsets and timings
    this->Setup();
    return inserted;
}